

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_jump_level(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t level;
  wchar_t choose_gen;
  char s [80];
  wchar_t local_bc;
  wchar_t local_b8 [20];
  char local_68 [80];
  
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"level",&local_bc);
  if (wVar2 != L'\0') {
    strnfmt((char *)local_b8,0x50,"Jump to level (0-%d): ",(ulong)(z_info->max_depth - 1));
    strnfmt(local_68,0x50,"%d",(ulong)(uint)(int)player->depth);
    _Var1 = get_string((char *)local_b8,local_68,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(local_68,&local_bc);
    if (!_Var1) {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"level",local_bc);
  }
  if ((L'\xffffffff' < local_bc) && ((uint)local_bc < (uint)z_info->max_depth)) {
    wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",local_b8);
    if (wVar2 != L'\0') {
      _Var1 = get_check("Choose cave profile? ");
      local_b8[0] = (wchar_t)_Var1;
      cmd_set_arg_choice((command_conflict *)cmd,"choice",local_b8[0]);
    }
    if (local_b8[0] != L'\0') {
      player->noscore = player->noscore | 0x10;
    }
    msg("You jump to dungeon level %d.",(ulong)(uint)local_bc);
    dungeon_change_level(player,local_bc);
    player->upkeep->energy_use = (uint)z_info->move_energy;
  }
  return;
}

Assistant:

void do_cmd_wiz_jump_level(struct command *cmd)
{
	int level, choose_gen;

	if (cmd_get_arg_number(cmd, "level", &level) != CMD_OK) {
		char prompt[80], s[80];

		strnfmt(prompt, sizeof(prompt), "Jump to level (0-%d): ",
			z_info->max_depth - 1);

		/* Set default */
		strnfmt(s, sizeof(s), "%d", player->depth);

		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &level)) return;
		cmd_set_arg_number(cmd, "level", level);
	}

	/* Paranoia */
	if (level < 0 || level >= z_info->max_depth) return;

	if (cmd_get_arg_choice(cmd, "choice", &choose_gen) != CMD_OK) {
		choose_gen = (get_check("Choose cave profile? ")) ? 1 : 0;
		cmd_set_arg_choice(cmd, "choice", choose_gen);
	}

	if (choose_gen) {
		player->noscore |= NOSCORE_JUMPING;
	}

	msg("You jump to dungeon level %d.", level);
	dungeon_change_level(player, level);

	/*
	 * Because of the structure of the game loop, need to take some energy,
	 * or the change level request will not be processed until after
	 * performing another action that takes energy.
	 */
	player->upkeep->energy_use = z_info->move_energy;
}